

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_huffman_encode_store(cram_codec *c,cram_block *b,char *prefix,int version)

{
  size_t sVar1;
  cram_codec *pcVar2;
  int iVar3;
  int iVar4;
  byte *__src;
  size_t __n;
  uchar *puVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double local_a8;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  double local_60;
  size_t l;
  char *tp;
  char *tmp;
  cram_huffman_code *codes;
  int local_30;
  int len;
  int i;
  int version_local;
  char *prefix_local;
  cram_block *b_local;
  cram_codec *c_local;
  
  codes._4_4_ = 0;
  pcVar2 = (c->field_6).byte_array_len.len_codec;
  __src = (byte *)malloc((long)((c->field_6).e_huffman.nvals * 6 + 0x10));
  if (__src == (byte *)0x0) {
    c_local._4_4_ = -1;
  }
  else {
    if (prefix != (char *)0x0) {
      __n = strlen(prefix);
      while (b->alloc <= b->byte + __n) {
        if (b->alloc == 0) {
          local_60 = 1024.0;
        }
        else {
          sVar1 = b->alloc;
          auVar6._8_4_ = (int)(sVar1 >> 0x20);
          auVar6._0_8_ = sVar1;
          auVar6._12_4_ = 0x45300000;
          local_60 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
        }
        b->alloc = (long)local_60 |
                   (long)(local_60 - 9.223372036854776e+18) & (long)local_60 >> 0x3f;
        puVar5 = (uchar *)realloc(b->data,b->alloc);
        b->data = puVar5;
      }
      memcpy(b->data + b->byte,prefix,__n);
      b->byte = __n + b->byte;
      codes._4_4_ = (int)__n;
    }
    if (((c->field_6).e_huffman.nvals & 0xffffff80U) == 0) {
      *__src = (byte)(c->field_6).e_huffman.nvals;
      local_64 = 1;
    }
    else {
      if (((c->field_6).e_huffman.nvals & 0xffffc000U) == 0) {
        *__src = (byte)((uint)(c->field_6).e_huffman.nvals >> 8) | 0x80;
        __src[1] = (byte)(c->field_6).e_huffman.nvals;
        local_68 = 2;
      }
      else {
        if (((c->field_6).e_huffman.nvals & 0xffe00000U) == 0) {
          *__src = (byte)((uint)(c->field_6).e_huffman.nvals >> 0x10) | 0xc0;
          __src[1] = (byte)((uint)(c->field_6).e_huffman.nvals >> 8);
          __src[2] = (byte)(c->field_6).e_huffman.nvals;
          local_6c = 3;
        }
        else {
          if (((c->field_6).e_huffman.nvals & 0xf0000000U) == 0) {
            *__src = (byte)((uint)(c->field_6).e_huffman.nvals >> 0x18) | 0xe0;
            __src[1] = (byte)((uint)(c->field_6).e_huffman.nvals >> 0x10);
            __src[2] = (byte)((uint)(c->field_6).e_huffman.nvals >> 8);
            __src[3] = (byte)(c->field_6).e_huffman.nvals;
            local_70 = 4;
          }
          else {
            *__src = (byte)((c->field_6).e_huffman.nvals >> 0x1c) | 0xf0;
            __src[1] = (byte)((c->field_6).e_huffman.nvals >> 0x14);
            __src[2] = (byte)((c->field_6).e_huffman.nvals >> 0xc);
            __src[3] = (byte)((c->field_6).e_huffman.nvals >> 4);
            __src[4] = (byte)(c->field_6).e_huffman.nvals & 0xf;
            local_70 = 5;
          }
          local_6c = local_70;
        }
        local_68 = local_6c;
      }
      local_64 = local_68;
    }
    l = (size_t)(__src + local_64);
    for (local_30 = 0; local_30 < (c->field_6).e_huffman.nvals; local_30 = local_30 + 1) {
      if (((&pcVar2->codec)[(long)local_30 * 4] & 0xffffff80) == E_NULL) {
        *(char *)l = (char)(&pcVar2->codec)[(long)local_30 * 4];
        local_74 = 1;
      }
      else {
        if (((&pcVar2->codec)[(long)local_30 * 4] & 0xffffc000) == E_NULL) {
          *(byte *)l = (byte)((&pcVar2->codec)[(long)local_30 * 4] >> 8) | 0x80;
          *(char *)(l + 1) = (char)(&pcVar2->codec)[(long)local_30 * 4];
          local_78 = 2;
        }
        else {
          if (((&pcVar2->codec)[(long)local_30 * 4] & 0xffe00000) == E_NULL) {
            *(byte *)l = (byte)((&pcVar2->codec)[(long)local_30 * 4] >> 0x10) | 0xc0;
            *(char *)(l + 1) = (char)((&pcVar2->codec)[(long)local_30 * 4] >> 8);
            *(char *)(l + 2) = (char)(&pcVar2->codec)[(long)local_30 * 4];
            local_7c = 3;
          }
          else {
            if (((&pcVar2->codec)[(long)local_30 * 4] & 0xf0000000) == E_NULL) {
              *(byte *)l = (byte)((&pcVar2->codec)[(long)local_30 * 4] >> 0x18) | 0xe0;
              *(char *)(l + 1) = (char)((&pcVar2->codec)[(long)local_30 * 4] >> 0x10);
              *(char *)(l + 2) = (char)((&pcVar2->codec)[(long)local_30 * 4] >> 8);
              *(char *)(l + 3) = (char)(&pcVar2->codec)[(long)local_30 * 4];
              local_80 = 4;
            }
            else {
              *(byte *)l = (byte)((int)(&pcVar2->codec)[(long)local_30 * 4] >> 0x1c) | 0xf0;
              *(char *)(l + 1) = (char)((int)(&pcVar2->codec)[(long)local_30 * 4] >> 0x14);
              *(char *)(l + 2) = (char)((int)(&pcVar2->codec)[(long)local_30 * 4] >> 0xc);
              *(char *)(l + 3) = (char)((int)(&pcVar2->codec)[(long)local_30 * 4] >> 4);
              *(byte *)(l + 4) = (byte)(&pcVar2->codec)[(long)local_30 * 4] & 0xf;
              local_80 = 5;
            }
            local_7c = local_80;
          }
          local_78 = local_7c;
        }
        local_74 = local_78;
      }
      l = l + (long)local_74;
    }
    if (((c->field_6).e_huffman.nvals & 0xffffff80U) == 0) {
      *(char *)l = (char)(c->field_6).e_huffman.nvals;
      local_84 = 1;
    }
    else {
      if (((c->field_6).e_huffman.nvals & 0xffffc000U) == 0) {
        *(byte *)l = (byte)((uint)(c->field_6).e_huffman.nvals >> 8) | 0x80;
        *(char *)(l + 1) = (char)(c->field_6).e_huffman.nvals;
        local_88 = 2;
      }
      else {
        if (((c->field_6).e_huffman.nvals & 0xffe00000U) == 0) {
          *(byte *)l = (byte)((uint)(c->field_6).e_huffman.nvals >> 0x10) | 0xc0;
          *(char *)(l + 1) = (char)((uint)(c->field_6).e_huffman.nvals >> 8);
          *(char *)(l + 2) = (char)(c->field_6).e_huffman.nvals;
          local_8c = 3;
        }
        else {
          if (((c->field_6).e_huffman.nvals & 0xf0000000U) == 0) {
            *(byte *)l = (byte)((uint)(c->field_6).e_huffman.nvals >> 0x18) | 0xe0;
            *(char *)(l + 1) = (char)((uint)(c->field_6).e_huffman.nvals >> 0x10);
            *(char *)(l + 2) = (char)((uint)(c->field_6).e_huffman.nvals >> 8);
            *(char *)(l + 3) = (char)(c->field_6).e_huffman.nvals;
            local_90 = 4;
          }
          else {
            *(byte *)l = (byte)((c->field_6).e_huffman.nvals >> 0x1c) | 0xf0;
            *(char *)(l + 1) = (char)((c->field_6).e_huffman.nvals >> 0x14);
            *(char *)(l + 2) = (char)((c->field_6).e_huffman.nvals >> 0xc);
            *(char *)(l + 3) = (char)((c->field_6).e_huffman.nvals >> 4);
            *(byte *)(l + 4) = (byte)(c->field_6).e_huffman.nvals & 0xf;
            local_90 = 5;
          }
          local_8c = local_90;
        }
        local_88 = local_8c;
      }
      local_84 = local_88;
    }
    l = l + (long)local_84;
    for (local_30 = 0; local_30 < (c->field_6).e_huffman.nvals; local_30 = local_30 + 1) {
      if ((*(uint *)((long)&pcVar2->out + (long)local_30 * 0x10 + 4) & 0xffffff80) == 0) {
        *(char *)l = (char)*(undefined4 *)((long)&pcVar2->out + (long)local_30 * 0x10 + 4);
        local_94 = 1;
      }
      else {
        if ((*(uint *)((long)&pcVar2->out + (long)local_30 * 0x10 + 4) & 0xffffc000) == 0) {
          *(byte *)l = (byte)((uint)*(undefined4 *)((long)&pcVar2->out + (long)local_30 * 0x10 + 4)
                             >> 8) | 0x80;
          *(char *)(l + 1) = (char)*(undefined4 *)((long)&pcVar2->out + (long)local_30 * 0x10 + 4);
          local_98 = 2;
        }
        else {
          if ((*(uint *)((long)&pcVar2->out + (long)local_30 * 0x10 + 4) & 0xffe00000) == 0) {
            *(byte *)l = (byte)((uint)*(undefined4 *)
                                       ((long)&pcVar2->out + (long)local_30 * 0x10 + 4) >> 0x10) |
                         0xc0;
            *(char *)(l + 1) =
                 (char)((uint)*(undefined4 *)((long)&pcVar2->out + (long)local_30 * 0x10 + 4) >> 8);
            *(char *)(l + 2) = (char)*(undefined4 *)((long)&pcVar2->out + (long)local_30 * 0x10 + 4)
            ;
            local_9c = 3;
          }
          else {
            if ((*(uint *)((long)&pcVar2->out + (long)local_30 * 0x10 + 4) & 0xf0000000) == 0) {
              *(byte *)l = (byte)((uint)*(undefined4 *)
                                         ((long)&pcVar2->out + (long)local_30 * 0x10 + 4) >> 0x18) |
                           0xe0;
              *(char *)(l + 1) =
                   (char)((uint)*(undefined4 *)((long)&pcVar2->out + (long)local_30 * 0x10 + 4) >>
                         0x10);
              *(char *)(l + 2) =
                   (char)((uint)*(undefined4 *)((long)&pcVar2->out + (long)local_30 * 0x10 + 4) >> 8
                         );
              *(char *)(l + 3) =
                   (char)*(undefined4 *)((long)&pcVar2->out + (long)local_30 * 0x10 + 4);
              local_a0 = 4;
            }
            else {
              *(byte *)l = (byte)((int)*(undefined4 *)
                                        ((long)&pcVar2->out + (long)local_30 * 0x10 + 4) >> 0x1c) |
                           0xf0;
              *(char *)(l + 1) =
                   (char)(*(int *)((long)&pcVar2->out + (long)local_30 * 0x10 + 4) >> 0x14);
              *(char *)(l + 2) =
                   (char)(*(int *)((long)&pcVar2->out + (long)local_30 * 0x10 + 4) >> 0xc);
              *(char *)(l + 3) =
                   (char)(*(int *)((long)&pcVar2->out + (long)local_30 * 0x10 + 4) >> 4);
              *(byte *)(l + 4) =
                   (byte)*(undefined4 *)((long)&pcVar2->out + (long)local_30 * 0x10 + 4) & 0xf;
              local_a0 = 5;
            }
            local_9c = local_a0;
          }
          local_98 = local_9c;
        }
        local_94 = local_98;
      }
      l = l + (long)local_94;
    }
    iVar3 = itf8_put_blk(b,c->codec);
    iVar4 = itf8_put_blk(b,(int)l - (int)__src);
    while (b->alloc <= b->byte + (l - (long)__src)) {
      if (b->alloc == 0) {
        local_a8 = 1024.0;
      }
      else {
        sVar1 = b->alloc;
        auVar7._8_4_ = (int)(sVar1 >> 0x20);
        auVar7._0_8_ = sVar1;
        auVar7._12_4_ = 0x45300000;
        local_a8 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
      }
      b->alloc = (long)local_a8 | (long)(local_a8 - 9.223372036854776e+18) & (long)local_a8 >> 0x3f;
      puVar5 = (uchar *)realloc(b->data,b->alloc);
      b->data = puVar5;
    }
    memcpy(b->data + b->byte,__src,l - (long)__src);
    b->byte = (l - (long)__src) + b->byte;
    c_local._4_4_ = iVar4 + iVar3 + codes._4_4_ + ((int)l - (int)__src);
    free(__src);
  }
  return c_local._4_4_;
}

Assistant:

int cram_huffman_encode_store(cram_codec *c, cram_block *b, char *prefix,
			      int version) {
    int i, len = 0;
    cram_huffman_code *codes = c->e_huffman.codes;
    /*
     * Up to code length 127 means 2.5e+26 bytes of data required (worst
     * case huffman tree needs symbols with freqs matching the Fibonacci
     * series). So guaranteed 1 byte per code.
     *
     * Symbols themselves could be 5 bytes (eg -1 is 5 bytes in itf8).
     *
     * Therefore 6*ncodes + 5 + 5 + 1 + 5 is max memory
     */
    char *tmp = malloc(6*c->e_huffman.nvals+16);
    char *tp = tmp;

    if (!tmp)
	return -1;

    if (prefix) {
	size_t l = strlen(prefix);
	BLOCK_APPEND(b, prefix, l);
	len += l;
    }

    tp += itf8_put(tp, c->e_huffman.nvals);
    for (i = 0; i < c->e_huffman.nvals; i++) {
	tp += itf8_put(tp, codes[i].symbol);
    }

    tp += itf8_put(tp, c->e_huffman.nvals);
    for (i = 0; i < c->e_huffman.nvals; i++) {
	tp += itf8_put(tp, codes[i].len);
    }

    len += itf8_put_blk(b, c->codec);
    len += itf8_put_blk(b, tp-tmp);
    BLOCK_APPEND(b, tmp, tp-tmp);
    len += tp-tmp;

    free(tmp);

    return len;
}